

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O1

void moira::sprintx(char **s,u64 value,DasmNumberFormat *fmt,int digits)

{
  bool bVar1;
  char *pcVar2;
  char cVar3;
  char cVar4;
  uint uVar5;
  long lVar6;
  
  bVar1 = fmt->upperCase;
  if (((value != 0) || (fmt->plainZero == false)) && (cVar3 = *fmt->prefix, cVar3 != '\0')) {
    lVar6 = 1;
    do {
      pcVar2 = *s;
      *s = pcVar2 + 1;
      *pcVar2 = cVar3;
      cVar3 = fmt->prefix[lVar6];
      lVar6 = lVar6 + 1;
    } while (cVar3 != '\0');
  }
  if (0 < digits) {
    lVar6 = (ulong)(uint)digits + 1;
    do {
      uVar5 = (uint)value & 0xf;
      cVar3 = (char)uVar5;
      cVar4 = cVar3 + '0';
      if (9 < uVar5) {
        cVar4 = cVar3 + (bVar1 ^ 1U) * ' ' + '7';
      }
      (*s)[lVar6 + -2] = cVar4;
      value = value >> 4;
      lVar6 = lVar6 + -1;
    } while (1 < lVar6);
  }
  *s = *s + digits;
  return;
}

Assistant:

static void sprintx(char *&s, u64 value, const DasmNumberFormat &fmt, int digits)
{
    char a = (fmt.upperCase ? 'A' : 'a') - 10;

    if (value || !fmt.plainZero) {

        for (int i = 0; fmt.prefix[i]; i++) *s++ = fmt.prefix[i];
    }
    for (int i = digits - 1; i >= 0; i--) {

        auto digit = char(value % 16);
        s[i] = (digit <= 9) ? ('0' + digit) : (a + digit);
        value /= 16;
    }
    s += digits;
}